

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5VocabResetCursor(Fts5VocabCursor *pCsr)

{
  Fts5IndexIter *pIndexIter;
  u8 *puVar1;
  
  pCsr->rowid = 0;
  pIndexIter = pCsr->pIter;
  if (pIndexIter != (Fts5IndexIter *)0x0) {
    puVar1 = pIndexIter[1].pData;
    fts5IterClose(pIndexIter);
    puVar1[0x3c] = '\0';
    puVar1[0x3d] = '\0';
    puVar1[0x3e] = '\0';
    puVar1[0x3f] = '\0';
  }
  if ((Fts5Structure *)pCsr->pStruct != (Fts5Structure *)0x0) {
    fts5StructureRelease((Fts5Structure *)pCsr->pStruct);
  }
  pCsr->pIter = (Fts5IndexIter *)0x0;
  pCsr->pStruct = (void *)0x0;
  sqlite3_free(pCsr->zLeTerm);
  pCsr->nLeTerm = -1;
  pCsr->zLeTerm = (char *)0x0;
  pCsr->bEof = 0;
  return;
}

Assistant:

static void fts5VocabResetCursor(Fts5VocabCursor *pCsr){
  pCsr->rowid = 0;
  sqlite3Fts5IterClose(pCsr->pIter);
  sqlite3Fts5StructureRelease(pCsr->pStruct);
  pCsr->pStruct = 0;
  pCsr->pIter = 0;
  sqlite3_free(pCsr->zLeTerm);
  pCsr->nLeTerm = -1;
  pCsr->zLeTerm = 0;
  pCsr->bEof = 0;
}